

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CodeGenerator::GenerateAll
          (CodeGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  pointer ppFVar1;
  FileDescriptor *pFVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = 0;
  do {
    ppFVar1 = (files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3;
    bVar3 = uVar5 <= uVar6;
    if (uVar5 <= uVar6) {
      return bVar3;
    }
    pFVar2 = ppFVar1[uVar6];
    iVar4 = (*this->_vptr_CodeGenerator[2])(this,pFVar2,parameter,generator_context,error);
    cVar7 = (char)iVar4;
    if ((error == (string *)0x0) || (cVar7 != '\0')) {
      if (error != (string *)0x0) goto LAB_0023cc4e;
    }
    else {
      if (error->_M_string_length != 0) goto LAB_0023cc5f;
      std::__cxx11::string::assign((char *)error);
LAB_0023cc4e:
      if (error->_M_string_length != 0) {
LAB_0023cc5f:
        std::operator+(&local_70,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar2
                       ,": ");
        std::operator+(&local_50,&local_70,error);
        std::__cxx11::string::operator=((string *)error,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        return (bool)cVar7;
      }
    }
    uVar6 = uVar6 + 1;
    if (cVar7 == '\0') {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool CodeGenerator::GenerateAll(
    const std::vector<const FileDescriptor*>& files,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {
  // Default implemenation is just to call the per file method, and prefix any
  // error string with the file to provide context.
  bool succeeded = true;
  for (int i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    succeeded = Generate(file, parameter, generator_context, error);
    if (!succeeded && error && error->empty()) {
      *error = "Code generator returned false but provided no error "
               "description.";
    }
    if (error && !error->empty()) {
      *error = file->name() + ": " + *error;
      break;
    }
    if (!succeeded) {
      break;
    }
  }
  return succeeded;
}